

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O1

drwav_result
drwav__read_chunk_header
          (drwav_read_proc onRead,void *pUserData,drwav_container container,
          drwav_uint64 *pRunningBytesReadOut,drwav_chunk_header *pHeaderOut)

{
  bool bVar1;
  uint uVar2;
  size_t sVar3;
  undefined1 uVar4;
  drwav_uint8 sizeInBytes [4];
  drwav_uint8 sizeInBytes_1 [8];
  undefined1 local_34 [2];
  undefined2 local_32;
  byte local_30;
  undefined7 local_2f;
  
  if (drwav_container_aiff < container) {
    return -10;
  }
  if (container == drwav_container_w64) {
    sVar3 = (*onRead)(pUserData,pHeaderOut,0x10);
    if (sVar3 == 0x10) {
      sVar3 = (*onRead)(pUserData,&local_30,8);
      if (sVar3 != 8) goto LAB_00147b85;
      pHeaderOut->sizeInBytes = CONCAT71(local_2f,local_30) - 0x18;
      uVar2 = local_30 & 7;
      pHeaderOut->paddingSize = uVar2;
      *pRunningBytesReadOut = *pRunningBytesReadOut + 0x18;
LAB_00147bbe:
      bVar1 = true;
      goto LAB_00147bc0;
    }
LAB_00147b7e:
    uVar2 = 0xffffffcb;
  }
  else {
    sVar3 = (*onRead)(pUserData,pHeaderOut,4);
    if (sVar3 != 4) goto LAB_00147b7e;
    sVar3 = (*onRead)(pUserData,local_34,4);
    if (sVar3 == 4) {
      if ((container == drwav_container_aiff) || (container == drwav_container_rifx)) {
        uVar4 = local_34[0];
        _local_34 = CONCAT12(local_34[1],local_32 << 8 | local_32 >> 8);
      }
      else {
        uVar4 = local_32._1_1_;
      }
      pHeaderOut->sizeInBytes = (ulong)CONCAT13(uVar4,_local_34);
      uVar2 = _local_34 & 1;
      pHeaderOut->paddingSize = uVar2;
      *pRunningBytesReadOut = *pRunningBytesReadOut + 8;
      goto LAB_00147bbe;
    }
LAB_00147b85:
    uVar2 = 0xfffffff6;
  }
  bVar1 = false;
LAB_00147bc0:
  if (bVar1) {
    uVar2 = 0;
  }
  return uVar2;
}

Assistant:

DRWAV_PRIVATE drwav_result drwav__read_chunk_header(drwav_read_proc onRead, void* pUserData, drwav_container container, drwav_uint64* pRunningBytesReadOut, drwav_chunk_header* pHeaderOut)
{
    if (container == drwav_container_riff || container == drwav_container_rifx || container == drwav_container_rf64 || container == drwav_container_aiff) {
        drwav_uint8 sizeInBytes[4];

        if (onRead(pUserData, pHeaderOut->id.fourcc, 4) != 4) {
            return DRWAV_AT_END;
        }

        if (onRead(pUserData, sizeInBytes, 4) != 4) {
            return DRWAV_INVALID_FILE;
        }

        pHeaderOut->sizeInBytes = drwav_bytes_to_u32_ex(sizeInBytes, container);
        pHeaderOut->paddingSize = drwav__chunk_padding_size_riff(pHeaderOut->sizeInBytes);

        *pRunningBytesReadOut += 8;
    } else if (container == drwav_container_w64) {
        drwav_uint8 sizeInBytes[8];

        if (onRead(pUserData, pHeaderOut->id.guid, 16) != 16) {
            return DRWAV_AT_END;
        }

        if (onRead(pUserData, sizeInBytes, 8) != 8) {
            return DRWAV_INVALID_FILE;
        }

        pHeaderOut->sizeInBytes = drwav_bytes_to_u64(sizeInBytes) - 24;    /* <-- Subtract 24 because w64 includes the size of the header. */
        pHeaderOut->paddingSize = drwav__chunk_padding_size_w64(pHeaderOut->sizeInBytes);
        *pRunningBytesReadOut += 24;
    } else {
        return DRWAV_INVALID_FILE;
    }

    return DRWAV_SUCCESS;
}